

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  uint uVar1;
  ImGuiWindow *window;
  ImDrawList *pIVar2;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow **ppIVar5;
  ImGuiIO *pIVar6;
  ulong uVar7;
  int n;
  int iVar8;
  int iVar9;
  ImDrawList **ppIVar10;
  ulong uVar11;
  ImGuiWindow *pIVar12;
  int n_1;
  long lVar13;
  ImGuiWindow *windows_to_render_top_most [2];
  
  pIVar3 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x10b1,"void ImGui::Render()");
  }
  iVar8 = GImGui->FrameCountEnded;
  if (iVar8 != GImGui->FrameCount) {
    EndFrame();
    iVar8 = pIVar3->FrameCount;
  }
  pIVar3->FrameCountRendered = iVar8;
  (pIVar3->IO).MetricsRenderWindows = 0;
  out_list = &pIVar3->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  if ((pIVar3->BackgroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar3->BackgroundDrawList);
  }
  pIVar12 = pIVar3->NavWindowingTarget;
  if (pIVar12 == (ImGuiWindow *)0x0) {
    windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar12->Flags & 0x2000) == 0) {
      windows_to_render_top_most[0] = pIVar12->RootWindow;
    }
    else {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    }
    pIVar12 = pIVar3->NavWindowingListWindow;
  }
  pIVar4 = windows_to_render_top_most[0];
  windows_to_render_top_most[1] = pIVar12;
  for (iVar8 = 0; iVar8 != (pIVar3->Windows).Size; iVar8 = iVar8 + 1) {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&pIVar3->Windows,iVar8);
    window = *ppIVar5;
    if (((window->Active == true) && (window->Hidden == false)) &&
       ((window != pIVar12 && window != pIVar4) && (window->Flags & 0x1000000) == 0)) {
      AddRootWindowToDrawData(window);
    }
  }
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    pIVar12 = windows_to_render_top_most[lVar13];
    if (((pIVar12 != (ImGuiWindow *)0x0) && (pIVar12->Active == true)) && (pIVar12->Hidden == false)
       ) {
      AddRootWindowToDrawData(pIVar12);
    }
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar3->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar3->ForegroundDrawList,(pIVar3->IO).MousePos,
                      (pIVar3->Style).MouseCursorScale,pIVar3->MouseCursor,0xffffffff,0xff000000,
                      0x30000000);
  }
  if ((pIVar3->ForegroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar3->ForegroundDrawList);
  }
  pIVar6 = GetIO();
  (pIVar3->DrawData).Valid = true;
  uVar1 = (pIVar3->DrawDataBuilder).Layers[0].Size;
  iVar8 = 0;
  if ((int)uVar1 < 1) {
    ppIVar10 = (ImDrawList **)0x0;
  }
  else {
    ppIVar10 = (pIVar3->DrawDataBuilder).Layers[0].Data;
  }
  (pIVar3->DrawData).CmdLists = ppIVar10;
  (pIVar3->DrawData).CmdListsCount = uVar1;
  (pIVar3->DrawData).TotalIdxCount = 0;
  (pIVar3->DrawData).TotalVtxCount = 0;
  (pIVar3->DrawData).DisplayPos.x = 0.0;
  (pIVar3->DrawData).DisplayPos.y = 0.0;
  (pIVar3->DrawData).DisplaySize = pIVar6->DisplaySize;
  (pIVar3->DrawData).FramebufferScale = pIVar6->DisplayFramebufferScale;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  iVar9 = 0;
  uVar11 = 0;
  while( true ) {
    if (uVar7 == uVar11) break;
    pIVar2 = (pIVar3->DrawDataBuilder).Layers[0].Data[uVar11];
    iVar9 = iVar9 + (pIVar2->VtxBuffer).Size;
    (pIVar3->DrawData).TotalVtxCount = iVar9;
    iVar8 = iVar8 + (pIVar2->IdxBuffer).Size;
    (pIVar3->DrawData).TotalIdxCount = iVar8;
    uVar11 = uVar11 + 1;
  }
  (pIVar3->IO).MetricsRenderVertices = iVar9;
  (pIVar3->IO).MetricsRenderIndices = iVar8;
  if ((0 < (int)uVar1) &&
     (UNRECOVERED_JUMPTABLE = (pIVar3->IO).RenderDrawListsFn,
     UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(&pIVar3->DrawData);
    return;
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();

    // Add background ImDrawList
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Add foreground ImDrawList
    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}